

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O3

pair<const_unsigned_char_*,_long>
duckdb_snappy::DecompressBranchless<char*>
          (uint8_t *ip,uint8_t *ip_limit,ptrdiff_t op,char *op_base,ptrdiff_t op_limit_min_slop)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  uint *puVar10;
  uint *puVar11;
  long lVar12;
  ptrdiff_t pVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  uint *puVar22;
  uint *puVar23;
  bool bVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  pair<const_unsigned_char_*,_long> pVar27;
  uint8_t safe_source [64];
  ushort local_90 [4];
  undefined1 local_88 [16];
  uint local_78 [18];
  
  pVar13 = op;
  if (op < op_limit_min_slop + -0x40 && 0x82 < (long)ip_limit - (long)ip) {
    uVar20 = (ulong)*ip;
    puVar22 = (uint *)(ip + 1);
    puVar11 = local_78;
    uVar14 = 0;
    do {
      puVar10 = puVar11;
      pVar13 = op;
      uVar21 = uVar14;
      bVar25 = true;
      do {
        bVar24 = bVar25;
        puVar11 = puVar22;
        lVar16 = uVar20 * 2;
        uVar15 = (ulong)*(short *)((anonymous_namespace)::kLengthMinusOffset + lVar16);
        uVar17 = (ulong)((uint)uVar20 & 3);
        bVar25 = (uVar20 & 3) != 0;
        puVar23 = (uint *)((long)puVar11 + (uVar20 >> 2) + 2);
        puVar22 = (uint *)((long)puVar11 + uVar17 + 1);
        bVar1 = *(byte *)((long)puVar23 + -1);
        if (bVar25) {
          bVar1 = *(byte *)((long)puVar22 + -1);
        }
        uVar20 = (ulong)bVar1;
        if (!bVar25) {
          puVar22 = puVar23;
        }
        uVar14 = uVar15 & 0xff;
        local_90[0] = 0;
        local_90[1] = 0xff;
        local_90[2] = 0xffff;
        local_90[3] = 0;
        uVar19 = (ulong)((uint)*(ushort *)(local_88 + uVar17 * 2 + -8) & *puVar11);
        uVar18 = uVar15 - uVar19;
        puVar23 = puVar11;
        if (uVar18 == 0 || (long)uVar15 < (long)uVar19) {
          op = pVar13 + uVar21;
          lVar16 = (op - uVar14) + uVar18;
          if (lVar16 < 0) {
            if (uVar17 != 0) goto LAB_01cf3a70;
            uVar6 = *(undefined8 *)puVar10;
            uVar7 = *(undefined8 *)(puVar10 + 2);
            uVar8 = *(undefined8 *)(puVar10 + 6);
            *(undefined8 *)(op_base + pVar13 + 0x10) = *(undefined8 *)(puVar10 + 4);
            *(undefined8 *)(op_base + pVar13 + 0x10 + 8) = uVar8;
            *(undefined8 *)(op_base + pVar13) = uVar6;
            *(undefined8 *)(op_base + pVar13 + 8) = uVar7;
            if (0x20 < uVar21) {
              uVar6 = *(undefined8 *)(puVar10 + 8);
              uVar7 = *(undefined8 *)(puVar10 + 10);
              uVar8 = *(undefined8 *)(puVar10 + 0xe);
              *(undefined8 *)(op_base + pVar13 + 0x30) = *(undefined8 *)(puVar10 + 0xc);
              *(undefined8 *)(op_base + pVar13 + 0x38) = uVar8;
              *(undefined8 *)(op_base + pVar13 + 0x20) = uVar6;
              *(undefined8 *)(op_base + pVar13 + 0x28) = uVar7;
            }
          }
          else {
            puVar23 = (uint *)(op_base + lVar16);
            if (uVar17 == 0) {
              puVar23 = puVar11;
            }
            puVar11 = puVar23;
            uVar6 = *(undefined8 *)puVar10;
            uVar7 = *(undefined8 *)(puVar10 + 2);
            uVar8 = *(undefined8 *)(puVar10 + 6);
            *(undefined8 *)(op_base + pVar13 + 0x10) = *(undefined8 *)(puVar10 + 4);
            *(undefined8 *)(op_base + pVar13 + 0x10 + 8) = uVar8;
            *(undefined8 *)(op_base + pVar13) = uVar6;
            *(undefined8 *)(op_base + pVar13 + 8) = uVar7;
            if (0x20 < uVar21) {
              uVar6 = *(undefined8 *)(puVar10 + 8);
              uVar7 = *(undefined8 *)(puVar10 + 10);
              uVar8 = *(undefined8 *)(puVar10 + 0xe);
              *(undefined8 *)(op_base + pVar13 + 0x30) = *(undefined8 *)(puVar10 + 0xc);
              *(undefined8 *)(op_base + pVar13 + 0x38) = uVar8;
              *(undefined8 *)(op_base + pVar13 + 0x20) = uVar6;
              *(undefined8 *)(op_base + pVar13 + 0x28) = uVar7;
            }
          }
        }
        else {
          if ((char)*(short *)((anonymous_namespace)::kLengthMinusOffset + lVar16) < '\0')
          goto LAB_01cf3a70;
          uVar2 = *puVar10;
          uVar3 = puVar10[1];
          uVar4 = puVar10[2];
          uVar5 = puVar10[3];
          uVar6 = *(undefined8 *)(puVar10 + 6);
          *(undefined8 *)(op_base + pVar13 + 0x10) = *(undefined8 *)(puVar10 + 4);
          *(undefined8 *)(op_base + pVar13 + 0x10 + 8) = uVar6;
          puVar23 = (uint *)(op_base + pVar13);
          *puVar23 = uVar2;
          puVar23[1] = uVar3;
          puVar23[2] = uVar4;
          puVar23[3] = uVar5;
          if (0x20 < uVar21) {
            uVar2 = puVar10[8];
            uVar3 = puVar10[9];
            uVar4 = puVar10[10];
            uVar5 = puVar10[0xb];
            uVar6 = *(undefined8 *)(puVar10 + 0xe);
            *(undefined8 *)(op_base + pVar13 + 0x30) = *(undefined8 *)(puVar10 + 0xc);
            *(undefined8 *)(op_base + pVar13 + 0x38) = uVar6;
            *(uint *)(op_base + pVar13 + 0x20) = uVar2;
            *(uint *)(op_base + pVar13 + 0x24) = uVar3;
            *(uint *)(op_base + pVar13 + 0x28) = uVar4;
            *(uint *)(op_base + pVar13 + 0x2c) = uVar5;
          }
          lVar16 = pVar13 + uVar21;
          if ((long)((lVar16 - uVar14) + uVar18) < 0) {
LAB_01cf3ab6:
            ip = (uint8_t *)((long)puVar11 + -1);
            pVar13 = lVar16;
            goto LAB_01cf3a99;
          }
          if (uVar14 - uVar18 < 0x10) {
            if (uVar14 == uVar18) goto LAB_01cf3ab6;
            lVar12 = 0;
            do {
              op_base[lVar12 + lVar16] =
                   op_base[lVar12 + (((uVar15 + uVar21 + pVar13) - uVar19) - uVar14)];
              lVar12 = lVar12 + 1;
            } while (lVar12 != 0x10);
            if (((anonymous_namespace)::Copy64BytesWithPatternExtension(char*,unsigned_long)::
                 pattern_sizes == '\0') &&
               (iVar9 = __cxa_guard_acquire(&(anonymous_namespace)::
                                             Copy64BytesWithPatternExtension(char*,unsigned_long)::
                                             pattern_sizes), iVar9 != 0)) {
              auVar26._8_4_ = 0x18;
              auVar26._0_8_ = CONCAT44(0x15121414,local_88._0_4_) & 0xffffffff000000ff | 0x12121100;
              auVar26._12_4_ = 0;
              (anonymous_namespace)::Copy64BytesWithPatternExtension(char*,unsigned_long)::
              pattern_sizes = auVar26 | _DAT_01eeafe0;
              local_88 = (anonymous_namespace)::Copy64BytesWithPatternExtension(char*,unsigned_long)
                         ::pattern_sizes;
              __cxa_guard_release(&(anonymous_namespace)::
                                   Copy64BytesWithPatternExtension(char*,unsigned_long)::
                                   pattern_sizes);
            }
            bVar1 = (anonymous_namespace)::Copy64BytesWithPatternExtension(char*,unsigned_long)::
                    pattern_sizes[uVar14 - uVar18];
            lVar12 = 0x10;
            do {
              uVar6 = *(undefined8 *)(op_base + lVar12 + ((uVar21 + pVar13) - (ulong)bVar1) + 8);
              *(undefined8 *)(op_base + lVar12 + lVar16) =
                   *(undefined8 *)(op_base + lVar12 + ((uVar21 + pVar13) - (ulong)bVar1));
              *(undefined8 *)(op_base + lVar12 + lVar16 + 8) = uVar6;
              lVar12 = lVar12 + 0x10;
            } while (lVar12 != 0x40);
          }
          else {
            DecompressBranchless<char*>();
          }
          op = uVar14 + lVar16;
          uVar14 = 0;
          puVar11 = local_78;
        }
        puVar10 = puVar11;
        pVar13 = op;
        uVar21 = uVar14;
        bVar25 = false;
      } while (bVar24);
      puVar23 = puVar22;
    } while ((puVar22 < ip_limit + -0x81) && ((long)(op + uVar14) < op_limit_min_slop + -0x40));
LAB_01cf3a70:
    ip = (uint8_t *)((long)puVar23 + -1);
    if (uVar21 != 0) {
      uVar6 = *(undefined8 *)puVar10;
      uVar7 = *(undefined8 *)(puVar10 + 2);
      uVar8 = *(undefined8 *)(puVar10 + 6);
      *(undefined8 *)(op_base + pVar13 + 0x10) = *(undefined8 *)(puVar10 + 4);
      *(undefined8 *)(op_base + pVar13 + 0x10 + 8) = uVar8;
      *(undefined8 *)(op_base + pVar13) = uVar6;
      *(undefined8 *)(op_base + pVar13 + 8) = uVar7;
      if (0x20 < uVar21) {
        uVar6 = *(undefined8 *)(puVar10 + 8);
        uVar7 = *(undefined8 *)(puVar10 + 10);
        uVar8 = *(undefined8 *)(puVar10 + 0xe);
        *(undefined8 *)(op_base + pVar13 + 0x30) = *(undefined8 *)(puVar10 + 0xc);
        *(undefined8 *)(op_base + pVar13 + 0x38) = uVar8;
        *(undefined8 *)(op_base + pVar13 + 0x20) = uVar6;
        *(undefined8 *)(op_base + pVar13 + 0x28) = uVar7;
      }
      pVar13 = uVar21 + pVar13;
    }
  }
LAB_01cf3a99:
  pVar27.second = pVar13;
  pVar27.first = ip;
  return pVar27;
}

Assistant:

std::pair<const uint8_t*, ptrdiff_t> DecompressBranchless(
    const uint8_t* ip, const uint8_t* ip_limit, ptrdiff_t op, T op_base,
    ptrdiff_t op_limit_min_slop) {
  // If deferred_src is invalid point it here.
  uint8_t safe_source[64];
  const void* deferred_src;
  size_t deferred_length;
  ClearDeferred(&deferred_src, &deferred_length, safe_source);

  // We unroll the inner loop twice so we need twice the spare room.
  op_limit_min_slop -= kSlopBytes;
  if (2 * (kSlopBytes + 1) < ip_limit - ip && op < op_limit_min_slop) {
    const uint8_t* const ip_limit_min_slop = ip_limit - 2 * kSlopBytes - 1;
    ip++;
    // ip points just past the tag and we are touching at maximum kSlopBytes
    // in an iteration.
    size_t tag = ip[-1];
#if defined(__clang__) && defined(__aarch64__)
    // Workaround for https://bugs.llvm.org/show_bug.cgi?id=51317
    // when loading 1 byte, clang for aarch64 doesn't realize that it(ldrb)
    // comes with free zero-extension, so clang generates another
    // 'and xn, xm, 0xff' before it use that as the offset. This 'and' is
    // redundant and can be removed by adding this dummy asm, which gives
    // clang a hint that we're doing the zero-extension at the load.
    asm("" ::"r"(tag));
#endif
    do {
      // The throughput is limited by instructions, unrolling the inner loop
      // twice reduces the amount of instructions checking limits and also
      // leads to reduced mov's.

      SNAPPY_PREFETCH(ip + 128);
      for (int i = 0; i < 2; i++) {
        const uint8_t* old_ip = ip;
        assert(tag == ip[-1]);
        // For literals tag_type = 0, hence we will always obtain 0 from
        // ExtractLowBytes. For literals offset will thus be kLiteralOffset.
        ptrdiff_t len_minus_offset = kLengthMinusOffset[tag];
        uint32_t next;
#if defined(__aarch64__)
        size_t tag_type = AdvanceToNextTagARMOptimized(&ip, &tag);
        // We never need more than 16 bits. Doing a Load16 allows the compiler
        // to elide the masking operation in ExtractOffset.
        next = LittleEndian::Load16(old_ip);
#else
        size_t tag_type = AdvanceToNextTagX86Optimized(&ip, &tag);
        next = LittleEndian::Load32(old_ip);
#endif
        size_t len = len_minus_offset & 0xFF;
        ptrdiff_t extracted = ExtractOffset(next, tag_type);
        ptrdiff_t len_min_offset = len_minus_offset - extracted;
        if (SNAPPY_PREDICT_FALSE(len_minus_offset > extracted)) {
          if (SNAPPY_PREDICT_FALSE(len & 0x80)) {
            // Exceptional case (long literal or copy 4).
            // Actually doing the copy here is negatively impacting the main
            // loop due to compiler incorrectly allocating a register for
            // this fallback. Hence we just break.
          break_loop:
            ip = old_ip;
            goto exit;
          }
          // Only copy-1 or copy-2 tags can get here.
          assert(tag_type == 1 || tag_type == 2);
          std::ptrdiff_t delta = (op + deferred_length) + len_min_offset - len;
          // Guard against copies before the buffer start.
          // Execute any deferred MemCopy since we write to dst here.
          MemCopy64(op_base + op, deferred_src, deferred_length);
          op += deferred_length;
          ClearDeferred(&deferred_src, &deferred_length, safe_source);
          if (SNAPPY_PREDICT_FALSE(delta < 0 ||
                                  !Copy64BytesWithPatternExtension(
                                      op_base + op, len - len_min_offset))) {
            goto break_loop;
          }
          // We aren't deferring this copy so add length right away.
          op += len;
          continue;
        }
        std::ptrdiff_t delta = (op + deferred_length) + len_min_offset - len;
        if (SNAPPY_PREDICT_FALSE(delta < 0)) {
          // Due to the spurious offset in literals have this will trigger
          // at the start of a block when op is still smaller than 256.
          if (tag_type != 0) goto break_loop;
          MemCopy64(op_base + op, deferred_src, deferred_length);
          op += deferred_length;
          DeferMemCopy(&deferred_src, &deferred_length, old_ip, len);
          continue;
        }

        // For copies we need to copy from op_base + delta, for literals
        // we need to copy from ip instead of from the stream.
        const void* from =
            tag_type ? reinterpret_cast<void*>(op_base + delta) : old_ip;
        MemCopy64(op_base + op, deferred_src, deferred_length);
        op += deferred_length;
        DeferMemCopy(&deferred_src, &deferred_length, from, len);
      }
    } while (ip < ip_limit_min_slop &&
             static_cast<ptrdiff_t>(op + deferred_length) < op_limit_min_slop);
  exit:
    ip--;
    assert(ip <= ip_limit);
  }
  // If we deferred a copy then we can perform.  If we are up to date then we
  // might not have enough slop bytes and could run past the end.
  if (deferred_length) {
    MemCopy64(op_base + op, deferred_src, deferred_length);
    op += deferred_length;
    ClearDeferred(&deferred_src, &deferred_length, safe_source);
  }
  return {ip, op};
}